

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::write_decimal<int>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
           *this,int value)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  internal *piVar5;
  char *local_50;
  undefined1 uStack_48;
  undefined7 uStack_47;
  undefined1 uStack_40;
  undefined8 uStack_3f;
  
  piVar5._0_4_ = (internal *)-value;
  if (0 < value) {
    piVar5._0_4_ = (internal *)value;
  }
  iVar4 = internal::count_digits((uint32_t)piVar5._0_4_);
  if (value < 0) {
    pcVar1 = (this->out_).super_truncating_iterator_base<char_*>.out_;
    uVar2 = (this->out_).super_truncating_iterator_base<char_*>.count_;
    uVar3 = (this->out_).super_truncating_iterator_base<char_*>.limit_;
    internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator++
              (&this->out_);
    if (uVar2 < uVar3) {
      *pcVar1 = '-';
    }
  }
  internal::
  format_decimal<char,unsigned_int,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,fmt::v5::internal::no_thousands_sep>
            (&local_50,piVar5._0_4_,iVar4);
  *(ulong *)((long)&(this->out_).super_truncating_iterator_base<char_*>.limit_ + 1) =
       CONCAT17(uStack_40,uStack_47);
  *(undefined8 *)((long)&(this->out_).super_truncating_iterator_base<char_*>.count_ + 1) = uStack_3f
  ;
  (this->out_).super_truncating_iterator_base<char_*>.out_ = local_50;
  (this->out_).super_truncating_iterator_base<char_*>.limit_ = CONCAT71(uStack_47,uStack_48);
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }